

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_0>
           *kernel)

{
  DstXprType *pDVar1;
  PointerType pdVar2;
  ulong uVar3;
  Index IVar4;
  long lVar5;
  ulong uVar6;
  Index inner_1;
  long row_00;
  Index row;
  ulong row_01;
  ulong uVar7;
  Index col;
  long col_00;
  
  pDVar1 = (kernel->
           super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_1>
           ).m_dstExpr;
  pdVar2 = (pDVar1->
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
           m_data;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar3 = (pDVar1->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
            m_rows.m_value;
    lVar5 = (pDVar1->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
            m_cols.m_value;
    IVar4 = (pDVar1->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
            m_outerStride;
    uVar6 = (ulong)((uint)((ulong)pdVar2 >> 3) & 1);
    if ((long)uVar3 <= (long)uVar6) {
      uVar6 = uVar3;
    }
    col_00 = 0;
    if (lVar5 < 1) {
      lVar5 = col_00;
    }
    for (; col_00 != lVar5; col_00 = col_00 + 1) {
      uVar7 = 0;
      if (0 < (long)uVar6) {
        uVar7 = uVar6;
      }
      for (row_01 = 0; uVar7 != row_01; row_01 = row_01 + 1) {
        generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_1>
        ::assignCoeff(&kernel->
                       super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_1>
                      ,row_01,col_00);
      }
      row_00 = (uVar3 - uVar6 & 0xfffffffffffffffe) + uVar6;
      for (uVar7 = uVar6; (long)uVar7 < row_00; uVar7 = uVar7 + 2) {
        generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>>,Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>,1>>,Eigen::internal::swap_assign_op<double>,0>
        ::assignPacket<16,0,double__vector(2)>
                  ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>,Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>,1>>,Eigen::internal::swap_assign_op<double>,0>
                    *)kernel,uVar7,col_00);
      }
      for (; row_00 < (long)uVar3; row_00 = row_00 + 1) {
        generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_1>
        ::assignCoeff(&kernel->
                       super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_1>
                      ,row_00,col_00);
      }
      uVar6 = (long)(uVar6 + ((uint)IVar4 & 1)) % 2;
      if ((long)uVar3 < (long)uVar6) {
        uVar6 = uVar3;
      }
    }
    return;
  }
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>,_Eigen::internal::evaluator<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1>_>,_Eigen::internal::swap_assign_op<double>,_0>,_0,_0>
  ::run(kernel);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      packetSize = unpacket_traits<PacketType>::size,
      requestedAlignment = int(Kernel::AssignmentTraits::InnerRequiredAlignment),
      alignable = packet_traits<Scalar>::AlignedOnScalar || int(Kernel::AssignmentTraits::DstAlignment)>=sizeof(Scalar),
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = alignable ? int(requestedAlignment)
                               : int(Kernel::AssignmentTraits::DstAlignment)
    };
    const Scalar *dst_ptr = kernel.dstDataPtr();
    if((!bool(dstIsAligned)) && (UIntPtr(dst_ptr) % sizeof(Scalar))>0)
    {
      // the pointer is not aligend-on scalar, so alignment is not possible
      return dense_assignment_loop<Kernel,DefaultTraversal,NoUnrolling>::run(kernel);
    }
    const Index packetAlignedMask = packetSize - 1;
    const Index innerSize = kernel.innerSize();
    const Index outerSize = kernel.outerSize();
    const Index alignedStep = alignable ? (packetSize - kernel.outerStride() % packetSize) & packetAlignedMask : 0;
    Index alignedStart = ((!alignable) || bool(dstIsAligned)) ? 0 : internal::first_aligned<requestedAlignment>(dst_ptr, innerSize);

    for(Index outer = 0; outer < outerSize; ++outer)
    {
      const Index alignedEnd = alignedStart + ((innerSize-alignedStart) & ~packetAlignedMask);
      // do the non-vectorizable part of the assignment
      for(Index inner = 0; inner<alignedStart ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      // do the vectorizable part of the assignment
      for(Index inner = alignedStart; inner<alignedEnd; inner+=packetSize)
        kernel.template assignPacketByOuterInner<dstAlignment, Unaligned, PacketType>(outer, inner);

      // do the non-vectorizable part of the assignment
      for(Index inner = alignedEnd; inner<innerSize ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      alignedStart = numext::mini((alignedStart+alignedStep)%packetSize, innerSize);
    }
  }